

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall
notch::io::PlainTextNetworkWriter::save(PlainTextNetworkWriter *this,LayerSpec *spec)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->out,"layer: ");
  poVar1 = std::operator<<(poVar1,(string *)spec);
  std::operator<<(poVar1,"\n");
  if (spec->inputDim != 0) {
    poVar1 = std::operator<<(this->out,"inputs: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
  }
  if (spec->outputDim != 0) {
    poVar1 = std::operator<<(this->out,"outputs: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
  }
  if ((spec->activation).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    poVar1 = std::operator<<(this->out,"activation: ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    (spec->activation).
                                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
    std::operator<<(poVar1,"\n");
  }
  if (((spec->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     ((spec->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    std::operator<<(this->out,"bias_and_weights:\n");
    saveWeightsAndBias(this,(spec->weights).
                            super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,
                       (spec->bias).
                       super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    return;
  }
  return;
}

Assistant:

void save(LayerSpec &spec) {
        out << "layer: " << spec.tag << "\n";
        if (spec.inputDim) {
            out << "inputs: " << spec.inputDim << "\n";
        }
        if (spec.outputDim) {
            out << "outputs: " << spec.outputDim << "\n";
        }
        if (spec.activation) {
            out << "activation: " << *spec.activation << "\n";
        }
        if (spec.weights && spec.bias) {
            out << "bias_and_weights:\n";
            saveWeightsAndBias(*spec.weights, *spec.bias);
        }
    }